

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.h
# Opt level: O3

bool __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::operator==
          (PerOperationSamplingStrategies *this,PerOperationSamplingStrategies *rhs)

{
  OperationSamplingStrategy *pOVar1;
  bool bVar2;
  OperationSamplingStrategy *rhs_00;
  OperationSamplingStrategy *this_00;
  
  if ((*(double *)(this + 8) != *(double *)(rhs + 8)) ||
     (NAN(*(double *)(this + 8)) || NAN(*(double *)(rhs + 8)))) {
    return false;
  }
  if ((*(double *)(this + 0x10) == *(double *)(rhs + 0x10)) &&
     (!NAN(*(double *)(this + 0x10)) && !NAN(*(double *)(rhs + 0x10)))) {
    this_00 = *(OperationSamplingStrategy **)(this + 0x18);
    pOVar1 = *(OperationSamplingStrategy **)(this + 0x20);
    rhs_00 = *(OperationSamplingStrategy **)(rhs + 0x18);
    if ((long)pOVar1 - (long)this_00 == *(long *)(rhs + 0x20) - (long)rhs_00) {
      for (; this_00 != pOVar1; this_00 = this_00 + 0x38) {
        bVar2 = OperationSamplingStrategy::operator==(this_00,rhs_00);
        if (!bVar2) {
          return false;
        }
        rhs_00 = rhs_00 + 0x38;
      }
      if ((((byte)rhs[0x38] ^ (byte)this[0x38]) & 1) == 0) {
        if (((byte)this[0x38] & 1) != 0) {
          if (*(double *)(this + 0x30) != *(double *)(rhs + 0x30)) {
            return false;
          }
          if (NAN(*(double *)(this + 0x30)) || NAN(*(double *)(rhs + 0x30))) {
            return false;
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool operator == (const PerOperationSamplingStrategies & rhs) const
  {
    if (!(defaultSamplingProbability == rhs.defaultSamplingProbability))
      return false;
    if (!(defaultLowerBoundTracesPerSecond == rhs.defaultLowerBoundTracesPerSecond))
      return false;
    if (!(perOperationStrategies == rhs.perOperationStrategies))
      return false;
    if (__isset.defaultUpperBoundTracesPerSecond != rhs.__isset.defaultUpperBoundTracesPerSecond)
      return false;
    else if (__isset.defaultUpperBoundTracesPerSecond && !(defaultUpperBoundTracesPerSecond == rhs.defaultUpperBoundTracesPerSecond))
      return false;
    return true;
  }